

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

vssListType * __thiscall
Instance::getVSS(vssListType *__return_storage_ptr__,Instance *this,int ttd)

{
  pointer piVar1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  Edge *this_00;
  ulong uVar5;
  expr eVar6;
  int currNode;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> ttdEdges;
  model m;
  int local_9c;
  vector<int,_std::allocator<int>_> local_98;
  vssListType *local_80;
  vector<const_Edge_*,_std::allocator<const_Edge_*>_> local_78;
  ast local_60;
  model local_50;
  ast local_40;
  
  z3::optimize::get_model((optimize *)&local_50);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_80 = __return_storage_ptr__;
  Graph::getTTD(&local_78,&this->graph,ttd);
  this_00 = *local_78.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar3 = Graph::isBoundary(&this->graph,this_00->from);
  local_9c = (&this_00->from)[!bVar3];
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_98,
               (iterator)
               local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_9c);
  }
  else {
    *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = local_9c;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1;
  }
  if (8 < (ulong)((long)local_78.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_78.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    uVar5 = 1;
    do {
      local_9c = Edge::getOtherVertex(this_00,local_9c);
      z3::ast_vector_tpl<z3::expr>::operator[]
                ((ast_vector_tpl<z3::expr> *)&local_40,(int)this + 0x170);
      eVar6 = z3::model::eval((model *)&local_60,(expr *)&local_50,SUB81(&local_40,0));
      iVar4 = Z3_get_bool_value(*(undefined8 *)
                                 (CONCAT44(local_60.super_object.m_ctx._4_4_,
                                           (int)local_60.super_object.m_ctx) + 8),local_60.m_ast,
                                eVar6.super_ast.m_ast);
      z3::ast::~ast(&local_60);
      z3::ast::~ast(&local_40);
      if (iVar4 == 1) {
        if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_98,
                     (iterator)
                     local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_9c);
        }
        else {
          *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_9c;
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(local_80,(value_type *)&local_98);
        piVar2 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        piVar1 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        if (piVar1 != (pointer)0x0) {
          operator_delete(piVar1,(long)piVar2 - (long)piVar1);
          goto LAB_0010481e;
        }
LAB_00104836:
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_98,
                   (iterator)
                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_9c);
      }
      else {
LAB_0010481e:
        if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_00104836;
        *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_9c;
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      this_00 = local_78.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_78.
                                   super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.
                                   super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_60.super_object.m_ctx._0_4_ = Edge::getOtherVertex(this_00,local_9c);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_98,
               (iterator)
               local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_60);
  }
  else {
    *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = (int)local_60.super_object.m_ctx;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::push_back(local_80,&local_98);
  if (local_78.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<const_Edge_*,_std::allocator<const_Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  z3::model::~model(&local_50);
  return local_80;
}

Assistant:

vssListType Instance::getVSS(int ttd) {
  model m = solver.get_model();
  vssListType vss;
  vssType currVss;
  std::vector<const Edge *> ttdEdges = graph.getTTD(ttd);
  const Edge *currEdge = ttdEdges[0];
  int currNode =
      graph.isBoundary(currEdge->from) ? currEdge->from : currEdge->to;
  currVss.push_back(currNode);
  for (size_t i = 1; i < ttdEdges.size(); i++) {
    if (m.eval(borderVars[(currNode = currEdge->getOtherVertex(currNode))],
               false)
            .bool_value() == Z3_TRUE) {
      currVss.push_back(currNode);
      vss.push_back(currVss);
      currVss = vssType();
    }
    currVss.push_back(currNode);
    currEdge = ttdEdges[i];
  }
  currVss.push_back(currEdge->getOtherVertex(currNode));
  vss.push_back(currVss);
  return vss;
}